

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embedded_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::EmbeddedGeometryInterface::computeEdgeCotanWeights
          (EmbeddedGeometryInterface *this)

{
  bool bVar1;
  SurfaceMesh *pSVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  Vector3 *pVVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  size_t i_1;
  long lVar16;
  runtime_error *this_00;
  long *plVar17;
  size_t i;
  ulong uVar18;
  long lVar19;
  pointer puVar20;
  size_type *psVar21;
  long *plVar22;
  ParentMeshT *pPVar23;
  pointer puVar24;
  ulong uVar25;
  pointer puVar26;
  size_t i_2;
  size_t sVar27;
  size_t sVar28;
  unsigned_long uVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 local_e8 [24];
  long lStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->vertexPositionsQ).super_DependentQuantity.computed == false) {
    if ((this->vertexPositionsQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->vertexPositionsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->vertexPositionsQ).super_DependentQuantity.evaluateFunc);
    (this->vertexPositionsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Edge,_double>::MeshData
            ((MeshData<geometrycentral::surface::Edge,_double> *)local_e8,
             (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
             super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Edge,_double>::operator=
            (&(this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
              edgeCotanWeights,(MeshData<geometrycentral::surface::Edge,_double> *)local_e8);
  MeshData<geometrycentral::surface::Edge,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Edge,_double> *)local_e8);
  pSVar2 = (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
           super_BaseGeometryInterface.mesh;
  sVar3 = pSVar2->nEdgesFillCount;
  if (sVar3 != 0) {
    puVar20 = (pSVar2->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar24 = (pSVar2->eHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar26 = puVar24;
    if (pSVar2->useImplicitTwinFlag != false) {
      puVar26 = puVar20;
    }
    if (*puVar26 == 0xffffffffffffffff) {
      sVar28 = 0;
      do {
        puVar24 = puVar24 + 1;
        puVar20 = puVar20 + 2;
        sVar27 = sVar3;
        if (sVar3 - 1 == sVar28) break;
        puVar26 = puVar24;
        if (pSVar2->useImplicitTwinFlag != false) {
          puVar26 = puVar20;
        }
        sVar28 = sVar28 + 1;
        sVar27 = sVar28;
      } while (*puVar26 == 0xffffffffffffffff);
      goto LAB_0019bcb7;
    }
  }
  sVar27 = 0;
LAB_0019bcb7:
  if (sVar27 != sVar3) {
    do {
      bVar1 = pSVar2->useImplicitTwinFlag;
      if (bVar1 == true) {
        uVar18 = sVar27 * 2;
      }
      else {
        uVar18 = (pSVar2->eHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar27];
      }
      puVar20 = (pSVar2->heFaceArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar4 = pSVar2->nFacesFillCount;
      uVar25 = uVar18;
      do {
        uVar29 = uVar18;
        if (puVar20[uVar25] < uVar4) break;
        if (bVar1 == false) {
          uVar25 = (pSVar2->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar25];
        }
        else {
          uVar25 = uVar25 ^ 1;
        }
      } while (uVar25 != uVar18);
      do {
        uVar5 = puVar20[uVar29];
        if (uVar5 < uVar4) break;
        if (bVar1 == false) {
          uVar29 = (pSVar2->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar29];
        }
        else {
          uVar29 = uVar29 ^ 1;
        }
      } while (uVar29 != uVar18);
      if ((uVar5 < uVar4) || (dVar46 = 0.0, uVar29 != uVar25)) {
        dVar46 = 0.0;
        do {
          puVar20 = (pSVar2->heNextArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (puVar20[puVar20[puVar20[uVar29]]] != uVar29) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/embedded_geometry_interface.cpp"
                       ,"");
            ::std::operator+(&local_70,"GC_SAFETY_ASSERT FAILURE from ",&local_b0);
            plVar17 = (long *)::std::__cxx11::string::append((char *)&local_70);
            local_128._M_dataplus._M_p = (pointer)*plVar17;
            psVar21 = (size_type *)(plVar17 + 2);
            if ((size_type *)local_128._M_dataplus._M_p == psVar21) {
              local_128.field_2._M_allocated_capacity = *psVar21;
              local_128.field_2._8_8_ = plVar17[3];
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar21;
            }
            local_128._M_string_length = plVar17[1];
            *plVar17 = (long)psVar21;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            ::std::__cxx11::to_string(&local_90,0x135);
            ::std::operator+(&local_50,&local_128,&local_90);
            plVar17 = (long *)::std::__cxx11::string::append((char *)&local_50);
            local_108 = (long *)*plVar17;
            plVar22 = plVar17 + 2;
            if (local_108 == plVar22) {
              local_f8 = *plVar22;
              lStack_f0 = plVar17[3];
              local_108 = &local_f8;
            }
            else {
              local_f8 = *plVar22;
            }
            local_100 = plVar17[1];
            *plVar17 = (long)plVar22;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            plVar17 = (long *)::std::__cxx11::string::append((char *)&local_108);
            local_e8._0_8_ = *plVar17;
            pPVar23 = (ParentMeshT *)(plVar17 + 2);
            if ((ParentMeshT *)local_e8._0_8_ == pPVar23) {
              local_e8._16_8_ = pPVar23->_vptr_SurfaceMesh;
              lStack_d0 = plVar17[3];
              local_e8._0_8_ = (ParentMeshT *)(local_e8 + 0x10);
            }
            else {
              local_e8._16_8_ = pPVar23->_vptr_SurfaceMesh;
            }
            local_e8._8_8_ = plVar17[1];
            *plVar17 = (long)pPVar23;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            ::std::runtime_error::runtime_error(this_00,(string *)local_e8);
            __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          pVVar6 = (this->vertexPositions).data.
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          puVar24 = (pSVar2->heVertexArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar7 = puVar24[puVar20[puVar20[uVar29]]];
          uVar8 = puVar24[puVar20[uVar29]];
          uVar9 = puVar24[uVar29];
          dVar10 = pVVar6[uVar9].x - pVVar6[uVar7].x;
          dVar11 = pVVar6[uVar9].y - pVVar6[uVar7].y;
          dVar12 = pVVar6[uVar9].z - pVVar6[uVar7].z;
          dVar13 = pVVar6[uVar8].x - pVVar6[uVar7].x;
          dVar14 = pVVar6[uVar8].y - pVVar6[uVar7].y;
          dVar15 = pVVar6[uVar8].z - pVVar6[uVar7].z;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = dVar14 * dVar12;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = dVar15;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = dVar11;
          auVar33 = vfmsub231sd_fma(auVar33,auVar45,auVar37);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = dVar15 * dVar10;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = dVar13;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = dVar12;
          auVar31 = vfmsub231sd_fma(auVar31,auVar41,auVar39);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar11 * dVar13;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = dVar14;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = dVar10;
          auVar35 = vfmsub231sd_fma(auVar35,auVar43,auVar40);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = auVar31._0_8_ * auVar31._0_8_;
          auVar33 = vfmadd231sd_fma(auVar32,auVar33,auVar33);
          auVar33 = vfmadd231sd_fma(auVar33,auVar35,auVar35);
          if (auVar33._0_8_ < 0.0) {
            dVar30 = sqrt(auVar33._0_8_);
          }
          else {
            auVar33 = vsqrtsd_avx(auVar33,auVar33);
            dVar30 = auVar33._0_8_;
          }
          auVar36._8_8_ = 0;
          auVar36._0_8_ = dVar15;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = dVar13;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = dVar11 * dVar14;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = dVar10;
          auVar33 = vfmadd213sd_fma(auVar38,auVar44,auVar34);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = dVar12;
          auVar33 = vfmadd213sd_fma(auVar36,auVar42,auVar33);
          if (pSVar2->useImplicitTwinFlag == true) {
            uVar29 = uVar29 ^ 1;
          }
          else {
            uVar29 = (pSVar2->heSiblingArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar29];
          }
          while (pSVar2->nFacesFillCount <=
                 (pSVar2->heFaceArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar29]) {
            if (pSVar2->useImplicitTwinFlag == false) {
              uVar29 = (pSVar2->heSiblingArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar29];
            }
            else {
              uVar29 = uVar29 ^ 1;
            }
          }
          dVar46 = dVar46 + (auVar33._0_8_ / dVar30) * 0.5;
        } while (uVar29 != uVar25);
      }
      (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.edgeCotanWeights.
      data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[sVar27] =
           dVar46;
      lVar16 = sVar27 * 8;
      lVar19 = sVar27 << 4;
      do {
        lVar16 = lVar16 + 8;
        lVar19 = lVar19 + 0x10;
        sVar28 = sVar3;
        if (sVar3 - 1 == sVar27) break;
        plVar17 = (long *)((long)(pSVar2->eHalfedgeArr).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar16);
        if (pSVar2->useImplicitTwinFlag != false) {
          plVar17 = (long *)((long)(pSVar2->heNextArr).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar19);
        }
        sVar27 = sVar27 + 1;
        sVar28 = sVar27;
      } while (*plVar17 == -1);
      sVar27 = sVar28;
    } while (sVar28 != sVar3);
  }
  return;
}

Assistant:

void EmbeddedGeometryInterface::computeEdgeCotanWeights() {
  vertexPositionsQ.ensureHave();

  edgeCotanWeights = EdgeData<double>(mesh);

  for (Edge e : mesh.edges()) {
    double cotSum = 0.;

    for (Halfedge he : e.adjacentInteriorHalfedges()) {
      // WARNING: Logic duplicated between cached and immediate version
      Halfedge heFirst = he;
      Vector3 pB = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pC = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pA = vertexPositions[he.vertex()];
      GC_SAFETY_ASSERT(he.next() == heFirst, "faces must be triangular");

      Vector3 vecR = pB - pA;
      Vector3 vecL = pC - pA;

      double cotValue = dot(vecR, vecL) / norm(cross(vecR, vecL));
      cotSum += cotValue / 2;
    }

    edgeCotanWeights[e] = cotSum;
  }
}